

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O1

string * bech32::encodeBasis(string *__return_storage_ptr__,string *hrp,
                            vector<unsigned_char,_std::allocator<unsigned_char>_> *dp,
                            _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_string_ptr_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
                            *checksumFunc)

{
  pointer puVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  runtime_error *prVar6;
  pointer puVar7;
  __string_type *__str;
  pointer puVar8;
  long lVar9;
  size_type sVar10;
  byte *pbVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> combined;
  string hrpCopy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> checksum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  string local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  anon_unknown.dwarf_8258::rejectHRPTooShort(hrp);
  anon_unknown.dwarf_8258::rejectHRPTooLong(hrp);
  puVar7 = (dp->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (dp->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 + (hrp->_M_string_length - (long)puVar7) + -0x54 < (pointer)0xffffffffffffffa5) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"length of hrp + length of dp is too large");
    goto LAB_00102a2f;
  }
  lVar9 = (long)puVar1 - (long)puVar7 >> 2;
  puVar8 = puVar7;
  if (0 < lVar9) {
    puVar8 = puVar7 + ((long)puVar1 - (long)puVar7 & 0xfffffffffffffffc);
    lVar9 = lVar9 + 1;
    puVar7 = puVar7 + 3;
    do {
      if ('\x1f' < (char)puVar7[-3]) {
        puVar7 = puVar7 + -3;
        goto LAB_00102876;
      }
      if ('\x1f' < (char)puVar7[-2]) {
        puVar7 = puVar7 + -2;
        goto LAB_00102876;
      }
      if ('\x1f' < (char)puVar7[-1]) {
        puVar7 = puVar7 + -1;
        goto LAB_00102876;
      }
      if ('\x1f' < (char)*puVar7) goto LAB_00102876;
      lVar9 = lVar9 + -1;
      puVar7 = puVar7 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)puVar1 - (long)puVar8;
  if (lVar9 == 1) {
LAB_0010285b:
    puVar7 = puVar8;
    if ((char)*puVar8 < ' ') {
      puVar7 = puVar1;
    }
  }
  else if (lVar9 == 2) {
LAB_00102853:
    puVar7 = puVar8;
    if ((char)*puVar8 < ' ') {
      puVar8 = puVar8 + 1;
      goto LAB_0010285b;
    }
  }
  else {
    puVar7 = puVar1;
    if ((lVar9 == 3) && (puVar7 = puVar8, (char)*puVar8 < ' ')) {
      puVar8 = puVar8 + 1;
      goto LAB_00102853;
    }
  }
LAB_00102876:
  if (puVar7 == puVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar2 = (hrp->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + hrp->_M_string_length);
    sVar4 = local_68._M_string_length;
    _Var3._M_p = local_68._M_dataplus._M_p;
    if (local_68._M_string_length != 0) {
      sVar10 = 0;
      do {
        iVar5 = tolower((int)_Var3._M_p[sVar10]);
        _Var3._M_p[sVar10] = (char)iVar5;
        sVar10 = sVar10 + 1;
      } while (sVar4 != sVar10);
    }
    (*checksumFunc)(&local_48,&local_68,dp);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    anon_unknown.dwarf_8258::cat(&local_80,dp,&local_48);
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    pbVar11 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar11 ==
          local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (byte *)0x0) {
          operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        return __return_storage_ptr__;
      }
      if (0x1f < *pbVar11) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pbVar11 = pbVar11 + 1;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"data part contains invalid character");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"data value is out of range");
LAB_00102a2f:
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string encodeBasis(const std::string &hrp, const std::vector<unsigned char> &dp,
                            std::vector<unsigned char> (*checksumFunc)(const std::string &, const std::vector<unsigned char> &)) {
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectBothPartsTooLong(hrp, dp);
        rejectDataValuesOutOfRange(dp);

        std::string hrpCopy = hrp;
        convertToLowercase(hrpCopy);
        std::vector<unsigned char> checksum = checksumFunc(hrpCopy, dp);
        std::string ret = hrpCopy + '1';
        std::vector<unsigned char> combined = cat(dp, checksum);
        ret.reserve(ret.size() + combined.size());
        for (unsigned char c : combined) {
            if(c > limits::VALID_CHARSET_SIZE - 1)
                throw std::runtime_error("data part contains invalid character");
            ret += charset[c];
        }
        return ret;
    }